

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicExpression<mp::LinTerms>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *cc,ItemNamer *vnam
               )

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  char *in_RDX;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *in_RSI;
  BasicStringRef<char> *in_RDI;
  ItemNamer *in_stack_ffffffffffffffd0;
  AlgebraicExpression<mp::LinTerms> *in_stack_ffffffffffffffd8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetVariable(in_RSI);
  ItemNamer::at((ItemNamer *)cc,(size_t)vnam);
  fmt::BasicStringRef<char>::BasicStringRef(in_RDI,in_RDX);
  value.size_ = (size_t)in_stack_ffffffffffffffe0;
  value.data_ = (char *)in_stack_ffffffffffffffd8;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)in_stack_ffffffffffffffd0,value);
  fmt::BasicStringRef<char>::BasicStringRef(in_RDI,in_RDX);
  value_00.size_ = (size_t)in_stack_ffffffffffffffe0;
  value_00.data_ = (char *)in_stack_ffffffffffffffd8;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)in_stack_ffffffffffffffd0,value_00);
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetExpression(in_RSI);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms,mp::ItemNamer>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ComplementarityConstraint<Expr>& cc,
                    ItemNamer& vnam) {
  wrt << vnam.at(cc.GetVariable());
  wrt << " complements ";
  WriteModelItem(wrt, cc.GetExpression(), vnam);
}